

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wait_test.c
# Opt level: O0

void test_wait_n(testing t)

{
  nsync_time abs_deadline;
  nsync_time abs_deadline_00;
  int iVar1;
  int iVar2;
  nsync_counter c_00;
  nsync_counter c_01;
  undefined8 *puVar3;
  closure *pcVar4;
  nsync_note pnVar5;
  nsync_note pnVar6;
  char *pcVar7;
  nsync_time nVar8;
  nsync_time nVar9;
  nsync_time abs_deadline_01;
  testing in_stack_fffffffffffffe50;
  nsync_waitable_s *lw_1;
  nsync_note cn_1;
  nsync_waitable_s *w_2;
  nsync_note n_1;
  nsync_waitable_s *lw;
  nsync_note cn;
  nsync_waitable_s *w_1;
  nsync_note n;
  nsync_waitable_s *w;
  nsync_counter c;
  int local_70;
  int local_6c;
  a_pwaitable apw;
  a_waitable aw;
  nsync_time deadline;
  nsync_time now;
  nsync_counter done;
  int nnote_expire;
  int nnote;
  int ncounter;
  int k;
  int j;
  int i;
  testing t_local;
  
  for (k = 0; k != 0x1e; k = k + 1) {
    c_00 = nsync::nsync_counter_new(0);
    memset(&apw.a_,0,0x10);
    memset(&local_70,0,0x10);
    nVar8 = nsync::nsync_time_now();
    nVar9 = nsync::nsync_time_ms(100);
    nVar8 = nsync::nsync_time_add(nVar8,nVar9);
    iVar2 = (int)apw.a_;
    while (iVar1 = (int)apw.a_, (int)apw.a_ < iVar2 + 10) {
      c_01 = nsync::nsync_counter_new(0);
      a_ensure_(&apw.a_,1,0x10);
      puVar3 = (undefined8 *)((long)aw.h_ + (long)(int)apw.a_ * 0x10);
      *puVar3 = c_01;
      puVar3[1] = nsync::nsync_counter_waitable_funcs;
      apw.a_._0_4_ = (int)apw.a_ + 1;
      for (nnote = 0; nnote != 4 && (int)apw.a_ < iVar2 + 10; nnote = nnote + 1) {
        nsync::nsync_counter_add(c_01,1);
        nsync::nsync_counter_add(c_00,1);
        pcVar4 = closure_decrement(decrement_at,c_01,nVar8,c_00);
        closure_fork(pcVar4);
      }
    }
    while (iVar2 = (int)apw.a_, (int)apw.a_ < iVar1 + 10) {
      nVar9.tv_nsec = 999999999;
      nVar9.tv_sec = 0x7fffffffffffffff;
      pnVar5 = nsync::nsync_note_new((nsync_note)0x0,nVar9);
      a_ensure_(&apw.a_,1,0x10);
      puVar3 = (undefined8 *)((long)aw.h_ + (long)(int)apw.a_ * 0x10);
      *puVar3 = pnVar5;
      puVar3[1] = &nsync::nsync_note_waitable_funcs;
      apw.a_._0_4_ = (int)apw.a_ + 1;
      nsync::nsync_counter_add(c_00,1);
      pcVar4 = closure_notify(notify_at,pnVar5,nVar8,c_00);
      closure_fork(pcVar4);
      for (nnote = 0; nnote != 4 && (int)apw.a_ < iVar1 + 10; nnote = nnote + 1) {
        abs_deadline_00.tv_nsec = 999999999;
        abs_deadline_00.tv_sec = 0x7fffffffffffffff;
        pnVar6 = nsync::nsync_note_new(pnVar5,abs_deadline_00);
        a_ensure_(&apw.a_,1,0x10);
        puVar3 = (undefined8 *)((long)aw.h_ + (long)(int)apw.a_ * 0x10);
        *puVar3 = pnVar6;
        puVar3[1] = &nsync::nsync_note_waitable_funcs;
        apw.a_._0_4_ = (int)apw.a_ + 1;
      }
    }
    while ((int)apw.a_ < iVar2 + 10) {
      pnVar5 = nsync::nsync_note_new((nsync_note)0x0,nVar8);
      a_ensure_(&apw.a_,1,0x10);
      puVar3 = (undefined8 *)((long)aw.h_ + (long)(int)apw.a_ * 0x10);
      *puVar3 = pnVar5;
      puVar3[1] = &nsync::nsync_note_waitable_funcs;
      apw.a_._0_4_ = (int)apw.a_ + 1;
      nsync::nsync_counter_add(c_00,1);
      pcVar4 = closure_notify(notify_at,pnVar5,nVar8,c_00);
      closure_fork(pcVar4);
      for (nnote = 0; nnote != 4 && (int)apw.a_ < iVar2 + 10; nnote = nnote + 1) {
        abs_deadline.tv_nsec = 999999999;
        abs_deadline.tv_sec = 0x7fffffffffffffff;
        pnVar6 = nsync::nsync_note_new(pnVar5,abs_deadline);
        a_ensure_(&apw.a_,1,0x10);
        puVar3 = (undefined8 *)((long)aw.h_ + (long)(int)apw.a_ * 0x10);
        *puVar3 = pnVar6;
        puVar3[1] = &nsync::nsync_note_waitable_funcs;
        apw.a_._0_4_ = (int)apw.a_ + 1;
      }
    }
    if ((int)apw.a_ != 0x1e) {
      pcVar7 = smprintf("array length not equal to number of counters");
      testing_error_(t,1,
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]nsync/build_O0/cpp/testing/wait_test.c"
                     ,0x66,pcVar7);
    }
    for (ncounter = 0; ncounter != (int)apw.a_; ncounter = ncounter + 1) {
      a_ensure_(&local_70,1,8);
      *(long *)((long)apw.h_ + (long)local_70 * 8) = (long)aw.h_ + (long)ncounter * 0x10;
      local_70 = local_70 + 1;
    }
    while (local_70 != 0) {
      nVar8.tv_nsec._0_4_ = local_70;
      nVar8.tv_sec = 999999999;
      nVar8.tv_nsec._4_4_ = 0;
      iVar2 = nsync::nsync_wait_n((nsync *)0x0,(void *)0x0,(_func_void_void_ptr *)0x0,
                                  (_func_void_void_ptr *)0x7fffffffffffffff,nVar8,apw.h_.len_,
                                  (nsync_waitable_s **)in_stack_fffffffffffffe50);
      if (iVar2 == local_70) {
        in_stack_fffffffffffffe50 = t;
        pcVar7 = smprintf("nsync_wait_n returned with no waiter ready");
        testing_error_(in_stack_fffffffffffffe50,1,
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]nsync/build_O0/cpp/testing/wait_test.c"
                       ,0x6f,pcVar7);
      }
      *(undefined8 *)((long)apw.h_ + (long)iVar2 * 8) =
           *(undefined8 *)((long)apw.h_ + (long)(local_70 + -1) * 8);
      if (local_70 < 1) {
        uRam0000000000000000 = 0;
      }
      else {
        local_70 = local_70 + -1;
      }
    }
    abs_deadline_01.tv_nsec = 0x7fffffffffffffff;
    abs_deadline_01.tv_sec = 999999999;
    nsync::nsync_counter_wait((nsync *)c_00,(nsync_counter)0x7fffffffffffffff,abs_deadline_01);
    for (nnote = 0; nnote != 10; nnote = nnote + 1) {
      nsync::nsync_counter_free(*(nsync_counter *)((long)aw.h_ + (long)nnote * 0x10));
    }
    for (; nnote < (int)apw.a_; nnote = nnote + 1) {
      nsync::nsync_note_free(*(nsync_note *)((long)aw.h_ + (long)nnote * 0x10));
    }
    if (0 < local_6c) {
      free((void *)apw.h_);
    }
    apw.h_.len_ = 0;
    apw.h_.max_ = 0;
    local_6c = 0;
    local_70 = 0;
    if (0 < apw.a_._4_4_) {
      free((void *)aw.h_);
    }
    aw.h_.len_ = 0;
    aw.h_.max_ = 0;
    apw.a_._4_4_ = 0;
    apw.a_._0_4_ = 0;
    nsync::nsync_counter_free(c_00);
  }
  return;
}

Assistant:

static void test_wait_n (testing t) {
	int i;
	int j;
	int k;
	int ncounter = 10;
	int nnote = 10;
	int nnote_expire = 10;
	for (i = 0; i != 30; i++) {
		nsync_counter done = nsync_counter_new (0);
		nsync_time now;
		nsync_time deadline;
		a_waitable aw;
		a_pwaitable apw;
		memset (&aw, 0, sizeof (aw));
		memset (&apw, 0, sizeof (apw));
		now = nsync_time_now ();
		deadline = nsync_time_add (now, nsync_time_ms (100));
		for (j = A_LEN (&aw); A_LEN (&aw) < j+ncounter;) {
			nsync_counter c = nsync_counter_new (0);
			struct nsync_waitable_s *w = &A_PUSH (&aw);
			w->v = c;
			w->funcs = &nsync_counter_waitable_funcs;
			for (k = 0; k != 4 && A_LEN (&aw) < j+ncounter; k++) {
				nsync_counter_add (c, 1);
				nsync_counter_add (done, 1);
				closure_fork (closure_decrement (&decrement_at, c, deadline, done));
			}
		}
		for (j = A_LEN (&aw); A_LEN (&aw) < j+nnote;) {
			nsync_note n = nsync_note_new (NULL, nsync_time_no_deadline);
			struct nsync_waitable_s *w = &A_PUSH (&aw);
			w->v = n;
			w->funcs = &nsync_note_waitable_funcs;
			nsync_counter_add (done, 1);
			closure_fork (closure_notify (&notify_at, n, deadline, done));
			for (k = 0; k != 4 && A_LEN (&aw) < j+nnote; k++) {
				nsync_note cn = nsync_note_new (n, nsync_time_no_deadline);
				struct nsync_waitable_s *lw = &A_PUSH (&aw);
				lw->v = cn;
				lw->funcs = &nsync_note_waitable_funcs;
			}
		}
		for (j = A_LEN (&aw); A_LEN (&aw) < j+nnote_expire;) {
			nsync_note n = nsync_note_new (NULL, deadline);
			struct nsync_waitable_s *w = &A_PUSH (&aw);
			w->v = n;
			w->funcs = &nsync_note_waitable_funcs;
			nsync_counter_add (done, 1);
			closure_fork (closure_notify (&notify_at, n, deadline, done));
			for (k = 0; k != 4 && A_LEN (&aw) < j+nnote; k++) {
				nsync_note cn = nsync_note_new (n, nsync_time_no_deadline);
				struct nsync_waitable_s *lw = &A_PUSH (&aw);
				lw->v = cn;
				lw->funcs = &nsync_note_waitable_funcs;
			}
		}
		if (ncounter + nnote + nnote_expire != A_LEN (&aw)) {
			TEST_ERROR (t, ("array length not equal to number of counters"));
		}
		for (j = 0; j != A_LEN (&aw); j++) {
			A_PUSH (&apw) = &A (&aw, j);
		}
		while (A_LEN (&apw) != 0) {
			k = nsync_wait_n (NULL, NULL, NULL, nsync_time_no_deadline,
					  A_LEN (&apw), &A (&apw, 0));
			if (k == A_LEN (&apw)) {
				TEST_ERROR (t, ("nsync_wait_n returned with no waiter ready"));
			}
			A (&apw, k) = A (&apw, A_LEN (&apw) - 1);
			A_DISCARD (&apw, 1);
		}
		nsync_counter_wait (done, nsync_time_no_deadline);
		for (k = 0; k != ncounter; k++) {
			nsync_counter_free ((nsync_counter) A (&aw, k).v);
		}
		for (; k < A_LEN (&aw); k++) {
			nsync_note_free ((nsync_note) A (&aw, k).v);
		}
		A_FREE (&apw);
		A_FREE (&aw);
		nsync_counter_free (done);
	}
}